

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O2

int dowipe(void)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = u.ucreamed;
  pcVar2 = body_part(2);
  if (uVar1 == 0) {
    pline("Your %s is already clean.",pcVar2);
  }
  else {
    sprintf(dowipe::buf,"wiping off your %s",pcVar2);
    set_occupation(wipeoff,dowipe::buf,0);
  }
  return 1;
}

Assistant:

int dowipe(void)
{
	if (u.ucreamed)  {
		static char buf[39];

		sprintf(buf, "wiping off your %s", body_part(FACE));
		set_occupation(wipeoff, buf, 0);
		/* Not totally correct; what if they change back after now
		 * but before they're finished wiping?
		 */
		return 1;
	}
	pline("Your %s is already clean.", body_part(FACE));
	return 1;
}